

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_DeletedKey_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_DeletedKey_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *pcVar2;
  uint *lhs;
  long in_RDI;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  key_type *in_stack_fffffffffffffe38;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe40;
  uint *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int iVar3;
  char *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  Type type;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffeb8;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffec0;
  AssertionResult local_128;
  key_type local_114;
  size_type local_100;
  undefined4 local_f4;
  AssertionResult local_f0;
  key_type local_dc;
  size_type local_c8;
  undefined4 local_bc;
  AssertionResult local_b8 [3];
  key_type local_88;
  key_type local_84;
  AssertionResult local_80;
  key_type local_6c;
  value_type local_3c;
  value_type local_c;
  
  type = (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  bVar1 = google::
          HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_deleted_key
                    ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    this_00 = (AssertHelper *)(in_RDI + 0x10);
    local_c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffe40,
                             (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8._M_head_impl);
    local_3c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffe40,
                              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8._M_head_impl);
    local_6c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_84 = google::
               BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xe5df98);
    local_88 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                          );
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48,
               (int *)in_stack_fffffffffffffe40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xe5e014);
      type = (Type)((ulong)pcVar2 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe60,
                 (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffec0,
                 (Message *)in_stack_fffffffffffffeb8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
      testing::Message::~Message((Message *)0xe5e071);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe5e0df);
    local_bc = 2;
    local_c8 = google::
               BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)0xe5e0f8);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (unsigned_long *)in_stack_fffffffffffffe40);
    iVar3 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffe60 =
           testing::AssertionResult::failure_message((AssertionResult *)0xe5e171);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe60,iVar3,in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffec0,
                 (Message *)in_stack_fffffffffffffeb8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
      testing::Message::~Message((Message *)0xe5e1ce);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe5e23f);
    pcVar2 = (char *)(in_RDI + 0x10);
    local_dc = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_f4 = 1;
    local_100 = google::
                BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0xe5e28c);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (pcVar2,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (unsigned_long *)in_stack_fffffffffffffe40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffe50 =
           testing::AssertionResult::failure_message((AssertionResult *)0xe5e305);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe60,(int)((ulong)pcVar2 >> 0x20),
                 in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffec0,
                 (Message *)in_stack_fffffffffffffeb8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
      testing::Message::~Message((Message *)0xe5e362);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe5e3d3);
    lhs = (uint *)(in_RDI + 0x10);
    local_114 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffe40,
                            (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    iVar3 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xe5e415);
    HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffe40,iVar3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (pcVar2,in_stack_fffffffffffffe50,(int *)lhs,(int *)in_stack_fffffffffffffe40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffe40 =
           (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xe5e4a3);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe60,(int)((ulong)pcVar2 >> 0x20),
                 in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffec0,
                 (Message *)in_stack_fffffffffffffeb8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
      testing::Message::~Message((Message *)0xe5e500);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe5e56e);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)0xe5e584);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (pcVar2,in_stack_fffffffffffffe50,lhs,(unsigned_long *)in_stack_fffffffffffffe40);
    iVar3 = (int)((ulong)pcVar2 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffeb0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::AssertionResult::failure_message((AssertionResult *)0xe5e5e8);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe60,iVar3,in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffec0,
                 (Message *)in_stack_fffffffffffffeb8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
      testing::Message::~Message((Message *)0xe5e634);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe5e696);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, DeletedKey) {
  if (!this->ht_.supports_deleted_key()) return;
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(this->ht_.deleted_key(), this->UniqueKey(1));
  EXPECT_EQ(2u, this->ht_.size());
  this->ht_.erase(this->UniqueKey(20));
  EXPECT_EQ(1u, this->ht_.size());

  // Changing the deleted key is fine.
  this->ht_.set_deleted_key(this->UniqueKey(2));
  EXPECT_EQ(this->ht_.deleted_key(), this->UniqueKey(2));
  EXPECT_EQ(1u, this->ht_.size());
}